

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_GeneratorPluginNotAllowed_Test
::~CommandLineInterfaceTest_GeneratorPluginNotAllowed_Test
          (CommandLineInterfaceTest_GeneratorPluginNotAllowed_Test *this)

{
  CommandLineInterfaceTest_GeneratorPluginNotAllowed_Test *this_local;
  
  ~CommandLineInterfaceTest_GeneratorPluginNotAllowed_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, GeneratorPluginNotAllowed) {
  // Test what happens if plugins aren't allowed.

  CreateTempFile("error.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");

  DisallowPlugins();
  Run("protocol_compiler --plug_out=TestParameter:$tmpdir "
      "--proto_path=$tmpdir error.proto");

  ExpectErrorSubstring("Unknown flag: --plug_out");
}